

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS
ref_phys_mask_strong_bcs(REF_GRID ref_grid,REF_DICT ref_dict,REF_BOOL *replace,REF_INT ldim)

{
  REF_NODE pRVar1;
  REF_STATUS RVar2;
  uint uVar3;
  int local_d4;
  REF_STATUS ref_private_macro_code_rxs;
  REF_INT nequ;
  REF_INT bc;
  REF_INT node;
  REF_INT i;
  REF_INT last;
  REF_INT first;
  REF_INT cell_node;
  REF_INT nodes [27];
  int local_44;
  REF_CELL pRStack_40;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_INT ldim_local;
  REF_BOOL *replace_local;
  REF_DICT ref_dict_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  local_d4 = 0;
  if (ldim % 5 == 0) {
    local_d4 = 5;
  }
  if (ldim % 6 == 0) {
    local_d4 = 6;
  }
  for (nequ = 0; nequ < pRVar1->max; nequ = nequ + 1) {
    if (((-1 < nequ) && (nequ < pRVar1->max)) && (-1 < pRVar1->global[nequ])) {
      for (bc = 0; bc < ldim; bc = bc + 1) {
        replace[bc + ldim * nequ] = 0;
      }
    }
  }
  pRStack_40 = ref_grid->cell[3];
  if (ref_grid->twod != 0) {
    pRStack_40 = ref_grid->cell[0];
  }
  local_44 = 0;
  do {
    if (pRStack_40->max <= local_44) {
      return 0;
    }
    RVar2 = ref_cell_nodes(pRStack_40,local_44,&first);
    if (RVar2 == 0) {
      ref_private_macro_code_rxs = -1;
      uVar3 = ref_dict_value(ref_dict,(&first)[pRStack_40->node_per],&ref_private_macro_code_rxs);
      if ((uVar3 != 0) && (uVar3 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x17d,"ref_phys_mask_strong_bcs",(ulong)uVar3,"bc");
        return uVar3;
      }
      for (last = 0; last < pRStack_40->node_per; last = last + 1) {
        nequ = (&first)[last];
        if (ref_private_macro_code_rxs == 4000) {
          node = local_d4 + 4;
          i = local_d4 + 1;
          for (bc = i; bc <= node; bc = bc + 1) {
            replace[bc + ldim * nequ] = 1;
          }
          if (local_d4 == 6) {
            replace[ldim * nequ + 0xb] = 1;
          }
        }
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_phys_mask_strong_bcs(REF_GRID ref_grid,
                                            REF_DICT ref_dict,
                                            REF_BOOL *replace, REF_INT ldim) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], cell_node;
  REF_INT first, last, i, node, bc;
  REF_INT nequ;

  nequ = 0;
  if (0 == ldim % 5) nequ = 5;
  if (0 == ldim % 6) nequ = 6;

  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < ldim; i++) {
      replace[i + ldim * node] = REF_FALSE;
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  if (ref_grid_twod(ref_grid)) ref_cell = ref_grid_edg(ref_grid);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    bc = REF_EMPTY;
    RXS(ref_dict_value(ref_dict, nodes[ref_cell_id_index(ref_cell)], &bc),
        REF_NOT_FOUND, "bc");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      node = nodes[cell_node];
      if (4000 == bc) {
        first = nequ + 1; /* first momentum */
        last = nequ + 4;  /* energy */
        for (i = first; i <= last; i++) replace[i + ldim * node] = REF_TRUE;
        if (6 == nequ) replace[nequ + 5 + ldim * node] = REF_TRUE; /* turb */
      }
    }
  }

  return REF_SUCCESS;
}